

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack14_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  uVar1 = *in;
  *out = uVar1 & 0x3fff;
  uVar2 = in[1];
  out[1] = uVar1 >> 0xe & 0x3fff;
  out[2] = uVar1 >> 0x1c;
  out[2] = uVar1 >> 0x1c | (uVar2 & 0x3ff) << 4;
  out[3] = uVar2 >> 10 & 0x3fff;
  out[4] = uVar2 >> 0x18;
  uVar1 = in[2];
  out[4] = uVar2 >> 0x18 | (uVar1 & 0x3f) << 8;
  out[5] = uVar1 >> 6 & 0x3fff;
  out[6] = uVar1 >> 0x14;
  uVar2 = in[3];
  out[6] = uVar1 >> 0x14 | (uVar2 & 3) << 0xc;
  auVar4 = vpbroadcastd_avx512vl();
  auVar4 = vpsrlvd_avx2(auVar4,_DAT_001aa3f0);
  auVar3._8_4_ = 0x3fff;
  auVar3._0_8_ = 0x3fff00003fff;
  auVar3._12_4_ = 0x3fff;
  auVar4 = vpandd_avx512vl(auVar4,auVar3);
  *(long *)(out + 7) = auVar4._0_8_;
  uVar1 = in[4];
  out[9] = uVar2 >> 0x1e;
  out[9] = uVar2 >> 0x1e | (uVar1 & 0xfff) << 2;
  out[10] = uVar1 >> 0xc & 0x3fff;
  uVar2 = in[5];
  out[0xb] = uVar1 >> 0x1a;
  out[0xb] = uVar1 >> 0x1a | (uVar2 & 0xff) << 6;
  uVar1 = in[6];
  out[0xc] = uVar2 >> 8 & 0x3fff;
  out[0xd] = uVar2 >> 0x16;
  out[0xd] = uVar2 >> 0x16 | (uVar1 & 0xf) << 10;
  out[0xe] = uVar1 >> 4 & 0x3fff;
  out[0xf] = uVar1 >> 0x12;
  return in + 7;
}

Assistant:

const uint32_t *__fastunpack14_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 14);
  out++;
  *out = ((*in) >> 14) % (1U << 14);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 10)) << (14 - 10);
  out++;
  *out = ((*in) >> 10) % (1U << 14);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 6)) << (14 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 14);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 2)) << (14 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 14);
  out++;
  *out = ((*in) >> 16) % (1U << 14);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 12)) << (14 - 12);
  out++;
  *out = ((*in) >> 12) % (1U << 14);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 8)) << (14 - 8);
  out++;
  *out = ((*in) >> 8) % (1U << 14);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 4)) << (14 - 4);
  out++;
  *out = ((*in) >> 4) % (1U << 14);
  out++;
  *out = ((*in) >> 18);
  ++in;
  out++;

  return in;
}